

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall
Lib::DArray<Kernel::Clause_*>::DArray(DArray<Kernel::Clause_*> *this,DArray<Kernel::Clause_*> *o)

{
  size_t sVar1;
  void *pvVar2;
  Clause **ppCVar3;
  DArray<Kernel::Clause_*> *in_RSI;
  ulong *in_RDI;
  size_t i;
  void *mem;
  size_t in_stack_ffffffffffffffd0;
  ulong uVar4;
  ulong local_20;
  
  sVar1 = size(in_RSI);
  *in_RDI = sVar1;
  sVar1 = size(in_RSI);
  in_RDI[1] = sVar1;
  if (*in_RDI == 0) {
    in_RDI[2] = 0;
  }
  else {
    pvVar2 = Lib::alloc(in_stack_ffffffffffffffd0);
    in_RDI[2] = (ulong)pvVar2;
    for (local_20 = 0; local_20 < *in_RDI; local_20 = local_20 + 1) {
      uVar4 = in_RDI[2];
      ppCVar3 = operator[](in_RSI,local_20);
      *(Clause **)(uVar4 + local_20 * 8) = *ppCVar3;
    }
  }
  return;
}

Assistant:

explicit DArray(const DArray& o)
    : _size(o.size()), _capacity(o.size())
  {
    if(_size==0) {
      _array=0;
      return;
    }
    void* mem = ALLOC_KNOWN(sizeof(C)*_capacity,"DArray<>");
    _array = static_cast<C*>(mem);
    for(size_t i=0; i<_size; i++) {
      ::new (&_array[i]) C(o[i]);
    }
  }